

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestCamelCaseFieldNames::SharedDtor(MessageLite *self)

{
  ForeignMessage *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[9]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 10));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[10]._internal_metadata_);
    this = (ForeignMessage *)self[0xb]._vptr_MessageLite;
    if (this != (ForeignMessage *)0x0) {
      proto2_unittest::ForeignMessage::~ForeignMessage(this);
    }
    operator_delete(this,0x20);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,0x6a83,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestCamelCaseFieldNames::SharedDtor(MessageLite& self) {
  TestCamelCaseFieldNames& this_ = static_cast<TestCamelCaseFieldNames&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.stringfield_.Destroy();
  this_._impl_.stringpiecefield_.Destroy();
  this_._impl_.cordfield_.Destroy();
  delete this_._impl_.messagefield_;
  this_._impl_.~Impl_();
}